

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O2

void __thiscall Rml::Context::ReleaseDragClone(Context *this)

{
  SharedPtr<StyleSheetContainer> local_28;
  
  if (this->drag_clone != (Element *)0x0) {
    Element::RemoveChild
              ((Element *)&stack0xffffffffffffffe8,
               (this->cursor_proxy)._M_t.
               super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
               super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
               super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl);
    ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr
              ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)&stack0xffffffffffffffe8);
    this->drag_clone = (Element *)0x0;
    local_28.super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_28.super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ElementDocument::SetStyleSheetContainer
              ((ElementDocument *)
               (this->cursor_proxy)._M_t.
               super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
               super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
               super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,&local_28);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_28.super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return;
}

Assistant:

void Context::ReleaseDragClone()
{
	if (drag_clone)
	{
		cursor_proxy->RemoveChild(drag_clone);
		drag_clone = nullptr;
		static_cast<ElementDocument&>(*cursor_proxy).SetStyleSheetContainer(nullptr);
	}
}